

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TOIFactoredRewardDecPOMDPDiscrete.cpp
# Opt level: O1

void __thiscall
TOIFactoredRewardDecPOMDPDiscrete::GetReward(TOIFactoredRewardDecPOMDPDiscrete *this)

{
  Index in_EDX;
  Index in_ESI;
  
  GetReward((TOIFactoredRewardDecPOMDPDiscrete *)
            (&(this->super_TOIDecPOMDPDiscrete).super_TransitionObservationIndependentMADPDiscrete.
              super_MultiAgentDecisionProcess.field_0x0 +
            *(long *)(*(long *)&(this->super_TOIDecPOMDPDiscrete).
                                super_TransitionObservationIndependentMADPDiscrete.
                                super_MultiAgentDecisionProcess + -0xe0)),in_ESI,in_EDX);
  return;
}

Assistant:

double TOIFactoredRewardDecPOMDPDiscrete::GetReward(Index sI, Index jaI) const
{
    double reward=0;
    vector<Index> indSIs=JointToIndividualStateIndices(sI),
        indAIs=JointToIndividualActionIndices(jaI);

    for(unsigned int i=0;i!=GetNrAgents();++i)
        reward+=GetIndividualReward(indSIs[i],indAIs[i],i);

    reward+=_m_p_rModel->Get(indSIs,indAIs);
//    reward+=_m_p_rModel->Get(sI,jaI);

#if DEBUG_TOIFactoredRewardDecPOMDPDiscrete
    cout << "GetReward(" << sI << "," << jaI << ") = " << reward << endl;
#endif
    return(reward);
}